

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O3

void __thiscall gimage::PNMImageIO::save(PNMImageIO *this,ImageFloat *image,char *name)

{
  float fVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  IOException *this_00;
  long *plVar5;
  undefined1 uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  string type;
  ofstream out;
  undefined1 auStack_288 [15];
  allocator local_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  long local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  int aiStack_210 [4];
  undefined1 *local_200;
  undefined1 *local_1f8;
  ios_base local_138 [264];
  undefined1 uVar7;
  
  cVar2 = gutil::isMSBFirst();
  iVar3 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,0);
  if (((char)iVar3 == '\0') || ((image->depth | 2U) != 3)) {
    this_00 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_250,name,&local_279);
    std::operator+(&local_278,"Can only save PNM images with depth 1 or 3 (",&local_250);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_278);
    local_230 = (undefined1  [8])*plVar5;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar5 + 2);
    if (local_230 == (undefined1  [8])paVar8) {
      local_220._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_220._8_8_ = plVar5[3];
      local_230 = (undefined1  [8])&local_220;
    }
    else {
      local_220._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_228 = plVar5[1];
    *plVar5 = (long)paVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    gutil::IOException::IOException(this_00,(string *)local_230);
    __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Pf","");
  if (image->depth == 3) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_278,0,(char *)local_278._M_string_length,0x12f3c8);
  }
  lVar9 = image->n;
  lVar10 = -lVar9;
  if (0 < lVar9) {
    lVar10 = lVar9;
  }
  if (lVar9 == 0) {
    fVar12 = -3.4028235e+38;
  }
  else {
    lVar9 = 0;
    fVar13 = -3.4028235e+38;
    do {
      fVar1 = image->pixel[lVar9];
      fVar12 = fVar13;
      if (((uint)ABS(fVar1) < 0x7f800000) && (fVar12 = fVar1, fVar1 <= fVar13)) {
        fVar12 = fVar13;
      }
      lVar9 = lVar9 + 1;
      fVar13 = fVar12;
    } while (lVar10 != lVar9);
  }
  anon_unknown_11::writePNMHeader
            (name,local_278._M_dataplus._M_p,image->width,image->height,0,
             (float)(~-(uint)(0.0 < fVar12) & 0x3f800000 |
                    (uint)(1.0 / fVar12) & -(uint)(0.0 < fVar12)));
  std::ofstream::ofstream(local_230);
  lVar9 = *(long *)((long)local_230 + -0x18);
  *(undefined4 *)((long)aiStack_210 + lVar9 + -4) = 5;
  std::ios::clear((int)auStack_288 + (int)lVar9 + 0x58);
  std::ofstream::open(local_230,(_Ios_Openmode)name);
  lVar9 = image->height;
  if (0 < image->height) {
    do {
      if (*(int *)((long)aiStack_210 + *(long *)((long)local_230 + -0x18)) != 0) break;
      lVar10 = image->width;
      local_258 = lVar9;
      if (0 < lVar10) {
        uVar4 = (ulong)(uint)image->depth;
        lVar11 = 0;
        do {
          if (0 < (int)uVar4) {
            lVar10 = 0;
            do {
              fVar12 = image->img[lVar10][lVar9 + -1][lVar11];
              uVar6 = (undefined1)((uint)fVar12 >> 8);
              uVar7 = (undefined1)((uint)fVar12 >> 0x10);
              if (cVar2 == '\0') {
                if (local_200 < local_1f8) {
                  *local_200 = (char)((uint)fVar12 >> 0x18);
                  local_200 = local_200 + 1;
                }
                else {
                  (**(code **)(local_228 + 0x68))(&local_228);
                }
                if (local_200 < local_1f8) {
                  *local_200 = uVar7;
                  local_200 = local_200 + 1;
                }
                else {
                  (**(code **)(local_228 + 0x68))(&local_228,(uint)fVar12 >> 0x10 & 0xff);
                }
                if (local_200 < local_1f8) {
                  *local_200 = uVar6;
                  local_200 = local_200 + 1;
                }
                else {
                  (**(code **)(local_228 + 0x68))(&local_228,(uint)fVar12 >> 8 & 0xff);
                }
                if (local_1f8 <= local_200) {
                  fVar12 = (float)((uint)fVar12 & 0xff);
                  goto LAB_00118917;
                }
LAB_00118848:
                *local_200 = SUB41(fVar12,0);
                local_200 = local_200 + 1;
              }
              else {
                if (local_200 < local_1f8) {
                  *local_200 = SUB41(fVar12,0);
                  local_200 = local_200 + 1;
                }
                else {
                  (**(code **)(local_228 + 0x68))(&local_228,(uint)fVar12 & 0xff);
                }
                if (local_200 < local_1f8) {
                  *local_200 = uVar6;
                  local_200 = local_200 + 1;
                }
                else {
                  (**(code **)(local_228 + 0x68))(&local_228,(uint)fVar12 >> 8 & 0xff);
                }
                if (local_200 < local_1f8) {
                  *local_200 = uVar7;
                  local_200 = local_200 + 1;
                }
                else {
                  (**(code **)(local_228 + 0x68))(&local_228,(uint)fVar12 >> 0x10 & 0xff);
                }
                fVar12 = (float)((uint)fVar12 >> 0x18);
                if (local_200 < local_1f8) goto LAB_00118848;
LAB_00118917:
                (**(code **)(local_228 + 0x68))(&local_228,fVar12);
              }
              lVar10 = lVar10 + 1;
              uVar4 = (ulong)image->depth;
            } while (lVar10 < (long)uVar4);
            lVar10 = image->width;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < lVar10);
      }
      lVar9 = lVar9 + -1;
    } while (1 < local_258);
  }
  std::ofstream::close();
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _isMSBFirst;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  return;
}

Assistant:

void PNMImageIO::save(const ImageFloat &image, const char *name) const
{
  float p, s;
  char *c=reinterpret_cast<char *>(&p);
  bool msbfirst=gutil::isMSBFirst();

  if (!handlesFile(name, false) || (image.getDepth() != 1 && image.getDepth() != 3))
  {
    throw gutil::IOException("Can only save PNM images with depth 1 or 3 ("+std::string(name)+")");
  }

  std::string type="Pf";

  if (image.getDepth() == 3)
  {
    type="PF";
  }

  s=image.maxValue();

  if (s > 0)
  {
    s=1/s;
  }
  else
  {
    s=1;
  }

  writePNMHeader(name, type.c_str(), image.getWidth(), image.getHeight(),
                 0, s);

  try
  {
    std::ofstream out;
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
    out.open(name, std::ios::binary|std::ios::app);

    std::streambuf *sb=out.rdbuf();

    for (long k=image.getHeight()-1; k>=0 && out.good(); k--)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        for (int j=0; j<image.getDepth(); j++)
        {
          // we assume that the plattform uses IEEE 32 bit floating
          // point format, otherwise this will not work

          p=static_cast<float>(image.get(i, k, j));

          if (msbfirst)
          {
            sb->sputc(c[0]);
            sb->sputc(c[1]);
            sb->sputc(c[2]);
            sb->sputc(c[3]);
          }
          else
          {
            sb->sputc(c[3]);
            sb->sputc(c[2]);
            sb->sputc(c[1]);
            sb->sputc(c[0]);
          }
        }
      }
    }

    out.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}